

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

void DrawTextRecEx(Font font,char *text,Rectangle rec,float fontSize,float spacing,_Bool wordWrap,
                  Color tint,int selectStart,int selectLength,Color selectTint,Color selectBackTint)

{
  Vector2 position;
  undefined1 auVar1 [16];
  int iVar2;
  Color tint_00;
  byte bVar3;
  long lVar4;
  int iVar5;
  uint codepoint;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  CharInfo *pCVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined4 in_register_00000084;
  int iVar16;
  int iVar17;
  int tmp;
  int iVar18;
  bool bVar19;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar20;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  Rectangle rec_00;
  int codepointByteCount;
  int local_108;
  int local_e4;
  int local_dc;
  ulong local_d8;
  Color local_cc;
  Color local_c8;
  int local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  CharInfo *local_a0;
  undefined1 local_98 [16];
  Rectangle *local_88;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_78 = CONCAT44(in_register_00000084,selectLength);
  local_d8 = CONCAT44(in_register_0000000c,selectStart);
  auVar1._8_4_ = in_XMM1_Dc;
  auVar1._0_8_ = rec._8_8_;
  auVar1._12_4_ = in_XMM1_Dd;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = rec._0_8_;
  local_68._12_4_ = in_XMM0_Dd;
  if ((text != (char *)0x0) && (*text != '\0')) {
    lVar13 = 0;
    do {
      lVar4 = lVar13 + 1;
      lVar13 = lVar13 + 1;
    } while (text[lVar4] != '\0');
    iVar2 = (int)lVar13;
    if (iVar2 - 1U < 0x7fffffff) {
      local_c0 = fontSize / (float)font.baseSize;
      bVar8 = !wordWrap;
      local_70 = (ulong)(uint)font.charsCount;
      local_a0 = font.chars;
      local_88 = font.recs;
      iVar5 = (int)((float)(font.baseSize / 2 + font.baseSize) * local_c0);
      fVar20 = (float)font.baseSize * local_c0;
      local_58 = ZEXT416((uint)fVar20);
      local_80 = (ulong)(uint)(int)fVar20;
      local_98._4_4_ = rec.height;
      local_48 = (float)local_98._4_4_;
      fStack_44 = (float)local_98._4_4_;
      fStack_40 = (float)local_98._4_4_;
      fStack_3c = (float)local_98._4_4_;
      iVar18 = -1;
      local_b8 = 0.0;
      uStack_b4 = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
      iVar6 = 0;
      local_108 = 0;
      iVar17 = 0;
      iVar10 = -1;
      local_e4 = -1;
      local_cc = tint;
      local_c8 = selectTint;
      local_bc = spacing;
      local_98 = auVar1;
      do {
        local_dc = 0;
        codepoint = GetNextCodepoint(text + iVar17,&local_dc);
        uVar12 = 0x3f;
        if (0 < (int)local_70) {
          uVar7 = 0;
          pCVar11 = local_a0;
          do {
            uVar12 = uVar7;
            if (pCVar11->value == codepoint) break;
            uVar7 = uVar7 + 1;
            pCVar11 = pCVar11 + 1;
            uVar12 = 0x3f;
          } while (local_70 != uVar7);
        }
        iVar14 = iVar10;
        if (codepoint == 0x3f) {
          iVar9 = 1;
          iVar16 = iVar17;
LAB_0012f5f9:
          if (local_a0[uVar12].advanceX == 0) {
            fVar20 = local_88[uVar12].width;
          }
          else {
            fVar20 = (float)local_a0[uVar12].advanceX;
          }
          iVar15 = (int)(fVar20 * local_c0 + local_bc);
          if (bVar8) {
            if ((!wordWrap) && ((float)local_98._0_4_ <= (float)iVar15 + local_b8 + 1.0)) {
              iVar6 = iVar6 + iVar5;
              local_b8 = 0.0;
              uStack_b4 = 0;
              uStack_b0 = 0;
              uStack_ac = 0;
            }
            if (local_48 < (float)((int)local_80 + iVar6)) {
              return;
            }
            iVar17 = (int)local_d8;
            bVar8 = local_108 < (int)local_78 + iVar17;
            if (bVar8 && (iVar17 <= local_108 && -1 < iVar17)) {
              rec_00.x = (float)local_68._0_4_ + local_b8 + -1.0;
              rec_00.y = (float)local_68._4_4_ + (float)iVar6;
              rec_00.width = (float)iVar15;
              rec_00.height = (float)local_58._0_4_;
              local_c4 = iVar15;
              DrawRectangleRec(rec_00,selectBackTint);
              iVar15 = local_c4;
            }
            if ((codepoint != 9) && (codepoint != 0x20)) {
              tint_00 = local_cc;
              if (bVar8 && (iVar17 <= local_108 && -1 < iVar17)) {
                tint_00 = local_c8;
              }
              position.y = (float)iVar6 + (float)local_68._4_4_;
              position.x = local_b8 + (float)local_68._0_4_;
              DrawTextCodepoint(font,codepoint,position,fontSize,tint_00);
            }
LAB_0012f7a0:
            bVar8 = true;
            if ((wordWrap) && (iVar16 == iVar10)) {
              iVar6 = iVar6 + iVar5;
              local_d8 = (ulong)(uint)((iVar18 - local_108) + (int)local_d8);
              local_b8 = 0.0;
              uStack_b4 = 0;
              uStack_b0 = 0;
              uStack_ac = 0;
              bVar8 = false;
              iVar15 = 0;
              iVar14 = -1;
              local_108 = iVar18;
              iVar16 = iVar10;
              local_e4 = iVar10;
            }
          }
          else {
            bVar3 = 0;
            local_dc = iVar9;
LAB_0012f805:
            if ((codepoint < 0x21) && ((0x100000600U >> ((ulong)codepoint & 0x3f) & 1) != 0)) {
              iVar10 = iVar16;
            }
            if ((float)local_98._0_4_ <= (float)iVar15 + local_b8 + 1.0) {
              if (iVar10 < 1) {
                iVar10 = iVar16;
              }
              iVar17 = 0;
              if (iVar16 == iVar10) {
                iVar17 = local_dc;
              }
              iVar14 = iVar10 - iVar17;
              if (local_dc + local_e4 == iVar10 - iVar17) {
                iVar14 = iVar16 - local_dc;
              }
            }
            else {
              bVar19 = iVar17 + local_dc == iVar2;
              if (bVar19) {
                iVar10 = iVar16;
              }
              bVar8 = false;
              iVar14 = iVar10;
              if (!(bool)(bVar3 | bVar19)) goto LAB_0012f8a6;
            }
            iVar10 = local_108 + -1;
            iVar15 = 0;
            local_b8 = 0.0;
            uStack_b4 = 0;
            uStack_b0 = 0;
            uStack_ac = 0;
            bVar8 = true;
            local_108 = iVar18;
            iVar18 = iVar10;
            iVar16 = local_e4;
          }
        }
        else {
          iVar16 = iVar17 + local_dc + -1;
          iVar9 = local_dc;
          if (codepoint != 10) goto LAB_0012f5f9;
          if (!bVar8) {
            bVar3 = 1;
            iVar15 = 0;
            goto LAB_0012f805;
          }
          iVar15 = 0;
          if (wordWrap) goto LAB_0012f7a0;
          iVar6 = iVar6 + iVar5;
          iVar15 = 0;
          local_b8 = 0.0;
          uStack_b4 = 0;
          uStack_b0 = 0;
          uStack_ac = 0;
          bVar8 = true;
        }
LAB_0012f8a6:
        iVar10 = iVar14;
        local_b8 = local_b8 + (float)iVar15;
        iVar17 = iVar16 + 1;
        local_108 = local_108 + 1;
      } while (iVar17 < iVar2);
    }
  }
  return;
}

Assistant:

void DrawTextRecEx(Font font, const char *text, Rectangle rec, float fontSize, float spacing, bool wordWrap, Color tint, int selectStart, int selectLength, Color selectTint, Color selectBackTint)
{
    int length = TextLength(text);  // Total length in bytes of the text, scanned by codepoints in loop

    int textOffsetY = 0;            // Offset between lines (on line break '\n')
    float textOffsetX = 0.0f;       // Offset X to next character to draw

    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Word/character wrapping mechanism variables
    enum { MEASURE_STATE = 0, DRAW_STATE = 1 };
    int state = wordWrap? MEASURE_STATE : DRAW_STATE;

    int startLine = -1;         // Index where to begin drawing (where a line begins)
    int endLine = -1;           // Index where to stop drawing (where a line ends)
    int lastk = -1;             // Holds last value of the character position

    for (int i = 0, k = 0; i < length; i++, k++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;
        i += (codepointByteCount - 1);

        int glyphWidth = 0;
        if (codepoint != '\n')
        {
            glyphWidth = (font.chars[index].advanceX == 0)?
                         (int)(font.recs[index].width*scaleFactor + spacing):
                         (int)(font.chars[index].advanceX*scaleFactor + spacing);
        }

        // NOTE: When wordWrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in startLine and endLine, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wordWrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_STATE)
        {
            // TODO: There are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // Ref: http://jkorpela.fi/chars/spaces.html
            if ((codepoint == ' ') || (codepoint == '\t') || (codepoint == '\n')) endLine = i;

            if ((textOffsetX + glyphWidth + 1) >= rec.width)
            {
                endLine = (endLine < 1)? i : endLine;
                if (i == endLine) endLine -= codepointByteCount;
                if ((startLine + codepointByteCount) == endLine) endLine = (i - codepointByteCount);

                state = !state;
            }
            else if ((i + 1) == length)
            {
                endLine = i;

                state = !state;
            }
            else if (codepoint == '\n') state = !state;

            if (state == DRAW_STATE)
            {
                textOffsetX = 0;
                i = startLine;
                glyphWidth = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (codepoint == '\n')
            {
                if (!wordWrap)
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }
            }
            else
            {
                if (!wordWrap && ((textOffsetX + glyphWidth + 1) >= rec.width))
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }

                // When text overflows rectangle height limit, just stop drawing
                if ((textOffsetY + (int)(font.baseSize*scaleFactor)) > rec.height) break;

                // Draw selection background
                bool isGlyphSelected = false;
                if ((selectStart >= 0) && (k >= selectStart) && (k < (selectStart + selectLength)))
                {
                    DrawRectangleRec((Rectangle){ rec.x + textOffsetX - 1, rec.y + textOffsetY, (float)glyphWidth, (float)font.baseSize*scaleFactor }, selectBackTint);
                    isGlyphSelected = true;
                }

                // Draw current character glyph
                if ((codepoint != ' ') && (codepoint != '\t'))
                {
                    DrawTextCodepoint(font, codepoint, (Vector2){ rec.x + textOffsetX, rec.y + textOffsetY }, fontSize, isGlyphSelected? selectTint : tint);
                }
            }

            if (wordWrap && (i == endLine))
            {
                textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                textOffsetX = 0;
                startLine = endLine;
                endLine = -1;
                glyphWidth = 0;
                selectStart += lastk - k;
                k = lastk;

                state = !state;
            }
        }

        textOffsetX += glyphWidth;
    }
}